

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O3

void __thiscall
slang::syntax::ClockingDeclarationSyntax::ClockingDeclarationSyntax
          (ClockingDeclarationSyntax *this,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,Token globalOrDefault,
          Token clocking,Token blockName,Token at,EventExpressionSyntax *event,Token semi,
          SyntaxList<slang::syntax::MemberSyntax> *items,Token endClocking,
          NamedBlockClauseSyntax *endBlockName)

{
  size_type sVar1;
  pointer ppAVar2;
  pointer ppMVar3;
  SyntaxKind SVar4;
  undefined4 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  long lVar8;
  
  uVar7 = clocking._0_8_;
  uVar6 = globalOrDefault._0_8_;
  (this->super_MemberSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (this->super_MemberSyntax).super_SyntaxNode.kind = ClockingDeclaration;
  SVar4 = (attributes->super_SyntaxListBase).super_SyntaxNode.kind;
  uVar5 = *(undefined4 *)&(attributes->super_SyntaxListBase).super_SyntaxNode.field_0xc;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
       (attributes->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind = SVar4;
  *(undefined4 *)
   &(this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0xc = uVar5;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_00507f08;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.childCount =
       (attributes->super_SyntaxListBase).childCount;
  sVar1 = (attributes->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>)
          .size_;
  (this->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_ =
       (attributes->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).
       data_;
  (this->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_ = sVar1;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_00508348;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
       (SyntaxNode *)this;
  sVar1 = (this->super_MemberSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_;
  if (sVar1 != 0) {
    ppAVar2 = (this->super_MemberSyntax).attributes.
              super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_;
    lVar8 = 0;
    do {
      **(undefined8 **)((long)ppAVar2 + lVar8) = this;
      lVar8 = lVar8 + 8;
    } while (sVar1 << 3 != lVar8);
  }
  (this->globalOrDefault).kind = (short)uVar6;
  (this->globalOrDefault).field_0x2 = (char)((ulong)uVar6 >> 0x10);
  (this->globalOrDefault).numFlags = (NumericTokenFlags)(char)((ulong)uVar6 >> 0x18);
  (this->globalOrDefault).rawLen = (int)((ulong)uVar6 >> 0x20);
  (this->globalOrDefault).info = globalOrDefault.info;
  (this->clocking).kind = (short)uVar7;
  (this->clocking).field_0x2 = (char)((ulong)uVar7 >> 0x10);
  (this->clocking).numFlags = (NumericTokenFlags)(char)((ulong)uVar7 >> 0x18);
  (this->clocking).rawLen = (int)((ulong)uVar7 >> 0x20);
  (this->clocking).info = clocking.info;
  (this->blockName).kind = blockName.kind;
  (this->blockName).field_0x2 = blockName._2_1_;
  (this->blockName).numFlags = (NumericTokenFlags)blockName.numFlags.raw;
  (this->blockName).rawLen = blockName.rawLen;
  (this->blockName).info = blockName.info;
  (this->at).kind = at.kind;
  (this->at).field_0x2 = at._2_1_;
  (this->at).numFlags = (NumericTokenFlags)at.numFlags.raw;
  (this->at).rawLen = at.rawLen;
  (this->at).info = at.info;
  (this->event).ptr = event;
  (this->semi).kind = semi.kind;
  (this->semi).field_0x2 = semi._2_1_;
  (this->semi).numFlags = (NumericTokenFlags)semi.numFlags.raw;
  (this->semi).rawLen = semi.rawLen;
  (this->semi).info = semi.info;
  SVar4 = (items->super_SyntaxListBase).super_SyntaxNode.kind;
  uVar5 = *(undefined4 *)&(items->super_SyntaxListBase).super_SyntaxNode.field_0xc;
  (this->items).super_SyntaxListBase.super_SyntaxNode.parent =
       (items->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->items).super_SyntaxListBase.super_SyntaxNode.kind = SVar4;
  *(undefined4 *)&(this->items).super_SyntaxListBase.super_SyntaxNode.field_0xc = uVar5;
  (this->items).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_00507f08;
  (this->items).super_SyntaxListBase.childCount = (items->super_SyntaxListBase).childCount;
  sVar1 = (items->super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>).size_;
  (this->items).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.data_ =
       (items->super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>).data_;
  (this->items).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.size_ = sVar1;
  (this->items).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_0050b010;
  (this->endClocking).kind = endClocking.kind;
  (this->endClocking).field_0x2 = endClocking._2_1_;
  (this->endClocking).numFlags = (NumericTokenFlags)endClocking.numFlags.raw;
  (this->endClocking).rawLen = endClocking.rawLen;
  (this->endClocking).info = endClocking.info;
  this->endBlockName = endBlockName;
  (event->super_SequenceExprSyntax).super_SyntaxNode.parent = (SyntaxNode *)this;
  (this->items).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  sVar1 = (this->items).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.size_;
  if (sVar1 != 0) {
    ppMVar3 = (this->items).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.data_;
    lVar8 = 0;
    do {
      **(undefined8 **)((long)ppMVar3 + lVar8) = this;
      lVar8 = lVar8 + 8;
    } while (sVar1 << 3 != lVar8);
  }
  if (endBlockName != (NamedBlockClauseSyntax *)0x0) {
    (endBlockName->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  return;
}

Assistant:

ClockingDeclarationSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, Token globalOrDefault, Token clocking, Token blockName, Token at, EventExpressionSyntax& event, Token semi, const SyntaxList<MemberSyntax>& items, Token endClocking, NamedBlockClauseSyntax* endBlockName) :
        MemberSyntax(SyntaxKind::ClockingDeclaration, attributes), globalOrDefault(globalOrDefault), clocking(clocking), blockName(blockName), at(at), event(&event), semi(semi), items(items), endClocking(endClocking), endBlockName(endBlockName) {
        this->event->parent = this;
        this->items.parent = this;
        for (auto child : this->items)
            child->parent = this;
        if (this->endBlockName) this->endBlockName->parent = this;
    }